

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMNodeIDMap::add(DOMNodeIDMap *this,DOMAttr *attr)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  ulong uVar3;
  
  uVar3 = this->fNumEntries;
  if (this->fMaxEntries <= uVar3) {
    growTable(this);
    uVar3 = this->fNumEntries;
  }
  this->fNumEntries = uVar3 + 1;
  iVar1 = (*(attr->super_DOMNode)._vptr_DOMNode[0x2a])(attr);
  XVar2 = XMLString::hash((XMLCh *)CONCAT44(extraout_var,iVar1),this->fSize - 1);
  uVar3 = XVar2 + 1;
  while ((undefined1 *)0x1 <
         (undefined1 *)((long)&(this->fTable[uVar3]->super_DOMNode)._vptr_DOMNode + 1U)) {
    uVar3 = uVar3 + XVar2 + 1;
    if (this->fSize <= uVar3) {
      uVar3 = uVar3 % this->fSize;
    }
  }
  this->fTable[uVar3] = attr;
  return;
}

Assistant:

void DOMNodeIDMap::add(DOMAttr *attr)
{
	//
	//  If the table is getting too full, grow it.  We arbitrarily limit
	//   the table to 80 full, which should limit the average number of
	//   rehashes to a reasonable value.
	//
	if (fNumEntries >= fMaxEntries)
		growTable();

        fNumEntries++;

	//
	// Hash the value string from the ID attribute being added to the table
	//      0 < Initial hash value < table size.
	//      An initial hash of zero would cause the rehash to fail.
	//
	const XMLCh *id=attr->getValue();
        XMLSize_t initalHash = XMLString::hash(id, fSize-1);
	initalHash++;
	XMLSize_t currentHash = initalHash;

	//
	// Loop looking for an empty slot for this ID.
	//   Don't even bother checking to see if the ID is already there -
	//   the table is only filled by the parser from valid documents, which
	//   can not have duplicates.  Behavior of invalid docs is not defined.
	//
    while (fTable[currentHash]!=0 && fTable[currentHash]!=(DOMAttr *)-1)
	{
		currentHash += initalHash;  // rehash
        if (currentHash >= fSize)
            currentHash = currentHash % fSize;
    }

    //
    // We've found our slot.  Stick the pointer to the attr into it.
    //
    fTable[currentHash] = attr;

}